

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expertInline.hpp
# Opt level: O0

void __thiscall LinearExpert::m_step(LinearExpert *this)

{
  DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *this_00;
  NoAlias<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::MatrixBase> this_01;
  MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *other;
  NoAlias<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::MatrixBase> this_02;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::PartialReduxExpr<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::internal::member_sum<double,_double>,_1>_>_>
  *other_00;
  long in_RDI;
  Scalar __x;
  double dVar1;
  Scalar __x_00;
  Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>
  PVar2;
  XZ xz;
  ZZ zz;
  X meanX;
  Z meanZ;
  DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_inverse_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  *in_stack_fffffffffffff898;
  MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *in_stack_fffffffffffff8a0;
  DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  *in_stack_fffffffffffff8a8;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  *in_stack_fffffffffffff8b0;
  MatrixBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_0>_>
  *in_stack_fffffffffffff8b8;
  MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *in_stack_fffffffffffff8c0;
  MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *in_stack_fffffffffffff8c8;
  DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *in_stack_fffffffffffff8d0;
  StorageBaseType *in_stack_fffffffffffff8e0;
  double *in_stack_fffffffffffff8e8;
  double *in_stack_fffffffffffff8f0;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  *in_stack_fffffffffffff8f8;
  
  Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator/
            ((MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffff8f8,
             in_stack_fffffffffffff8f0);
  Eigen::Matrix<double,-1,1,0,-1,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
            ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffff8a0,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
              *)in_stack_fffffffffffff898);
  Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator/
            ((MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffff8f8,
             in_stack_fffffffffffff8f0);
  Eigen::Matrix<double,-1,1,0,-1,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
            ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffff8a0,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
              *)in_stack_fffffffffffff898);
  if ((*(double *)(in_RDI + 0x110) != 0.0) || (NAN(*(double *)(in_RDI + 0x110)))) {
    Eigen::operator*(in_stack_fffffffffffff8e8,(StorageBaseType *)in_stack_fffffffffffff8e0);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>const,Eigen::Matrix<double,-1,1,0,-1,1>const>>
    ::operator+((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                 *)in_stack_fffffffffffff8c8,in_stack_fffffffffffff8c0);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>const,Eigen::Matrix<double,-1,1,0,-1,1>const>const,Eigen::Matrix<double,-1,1,0,-1,1>const>>
    ::operator/(in_stack_fffffffffffff8f8,in_stack_fffffffffffff8f0);
    Eigen::Matrix<double,-1,1,0,-1,1>::operator=
              ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffff8a0,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                *)in_stack_fffffffffffff898);
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::operator=
              ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffff8a0,
               (Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffff898);
    IMLE::getSigma(*(IMLE **)(in_RDI + 0x78));
    Eigen::operator*(in_stack_fffffffffffff8e8,(StorageBaseType *)in_stack_fffffffffffff8e0);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
    ::asDiagonal((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  *)in_stack_fffffffffffff8a8);
    Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator+=
              ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffff8c0,
               (EigenBase<Eigen::DiagonalWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                *)in_stack_fffffffffffff8b8);
    Eigen::operator*(in_stack_fffffffffffff8e8,(StorageBaseType *)in_stack_fffffffffffff8e0);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::transpose
              ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffff898);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>const,Eigen::Matrix<double,-1,1,0,-1,1>const>>
    ::operator*((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                 *)in_stack_fffffffffffff8b8,
                (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_> *)
                in_stack_fffffffffffff8b0);
    Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::noalias
              ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffff898);
    Eigen::NoAlias<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::MatrixBase>::operator+=
              ((NoAlias<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::MatrixBase> *)
               in_stack_fffffffffffff8c0,
               (MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_0>_>
                *)in_stack_fffffffffffff8b8);
    Eigen::operator*(in_stack_fffffffffffff8e8,(StorageBaseType *)in_stack_fffffffffffff8e0);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::transpose
              ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffff898);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>const,Eigen::Matrix<double,-1,1,0,-1,1>const>>
    ::operator*((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                 *)in_stack_fffffffffffff8b8,
                (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_> *)
                in_stack_fffffffffffff8b0);
    Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::noalias
              ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffff898);
    Eigen::NoAlias<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::MatrixBase>::operator-=
              ((NoAlias<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::MatrixBase> *)
               in_stack_fffffffffffff8c0,
               (MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_0>_>
                *)in_stack_fffffffffffff8b8);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator/=
              (in_stack_fffffffffffff8d0,(Scalar *)in_stack_fffffffffffff8c8);
  }
  else {
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::operator=
              ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffff8a0,
               (Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffff898);
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::operator=
              ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffff8a0,
               (Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffff898);
    IMLE::getSigma(*(IMLE **)(in_RDI + 0x78));
    Eigen::operator*(in_stack_fffffffffffff8e8,(StorageBaseType *)in_stack_fffffffffffff8e0);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
    ::asDiagonal((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  *)in_stack_fffffffffffff8a8);
    Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator+=
              ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffff8c0,
               (EigenBase<Eigen::DiagonalWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                *)in_stack_fffffffffffff8b8);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::transpose
              ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffff898);
    Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator*
              ((MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffff8a0,
               (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_> *)
               in_stack_fffffffffffff898);
    Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::noalias
              ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffff898);
    Eigen::NoAlias<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::MatrixBase>::operator-=
              ((NoAlias<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::MatrixBase> *)
               in_stack_fffffffffffff8c0,
               (MatrixBase<Eigen::Product<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_0>_>
                *)in_stack_fffffffffffff8b8);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator/=
              (in_stack_fffffffffffff8d0,(Scalar *)in_stack_fffffffffffff8c8);
  }
  Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::inverse
            ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffff898);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::operator=
            ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffff8a0,
             (DenseBase<Eigen::Inverse<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)
             in_stack_fffffffffffff898);
  __x = Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::determinant
                  ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)0x305cfe);
  dVar1 = sqrt(__x);
  *(double *)(in_RDI + 0x238) = dVar1;
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix
            ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffff8a0,
             (Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffff898);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Ones((Index)in_stack_fffffffffffff8a8);
  Eigen::operator*(in_stack_fffffffffffff8e8,in_stack_fffffffffffff8e0);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>_>
  ::asDiagonal((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                *)in_stack_fffffffffffff8a8);
  Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator+=
            ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffff8c0,
             (EigenBase<Eigen::DiagonalWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>_>
              *)in_stack_fffffffffffff8b8);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::transpose
            ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffff898);
  Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator*
            ((MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffff8a0,
             (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_> *)
             in_stack_fffffffffffff898);
  Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::noalias
            ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffff898);
  Eigen::NoAlias<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::MatrixBase>::operator-=
            ((NoAlias<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::MatrixBase> *)
             in_stack_fffffffffffff8c0,
             (MatrixBase<Eigen::Product<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_0>_>
              *)in_stack_fffffffffffff8b8);
  Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::inverse
            ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffff898);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::operator=
            ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffff8a0,
             (DenseBase<Eigen::Inverse<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)
             in_stack_fffffffffffff898);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix
            ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffff8a0,
             (Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffff898);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::transpose
            ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffff898);
  Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator*
            ((MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffff8a0,
             (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_> *)
             in_stack_fffffffffffff898);
  Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::noalias
            ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffff898);
  Eigen::NoAlias<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::MatrixBase>::operator-=
            ((NoAlias<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::MatrixBase> *)
             in_stack_fffffffffffff8c0,
             (MatrixBase<Eigen::Product<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_0>_>
              *)in_stack_fffffffffffff8b8);
  PVar2 = Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                    (in_stack_fffffffffffff8a0,
                     (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                     in_stack_fffffffffffff898);
  Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::noalias
            ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffff898);
  Eigen::NoAlias<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::MatrixBase>::operator=
            ((NoAlias<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::MatrixBase> *)
             in_stack_fffffffffffff8c0,
             (MatrixBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
              *)in_stack_fffffffffffff8b8);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::operator=
            ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffff8a0,
             (Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffff898);
  this_00 = (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)(in_RDI + 0x28);
  Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator-
            (in_stack_fffffffffffff8c8,in_stack_fffffffffffff8c0);
  Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
            ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffff8b8,
             in_stack_fffffffffffff8b0);
  this_01 = Eigen::MatrixBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::noalias
                      ((MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                       in_stack_fffffffffffff898);
  Eigen::NoAlias<Eigen::Matrix<double,-1,1,0,-1,1>,Eigen::MatrixBase>::operator+=
            ((NoAlias<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::MatrixBase> *)
             in_stack_fffffffffffff8c0,in_stack_fffffffffffff8b8);
  other_00 = (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::PartialReduxExpr<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::internal::member_sum<double,_double>,_1>_>_>
              *)(in_RDI + 0x108);
  other = (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
          IMLE::getPsi(*(IMLE **)(in_RDI + 0x78));
  Eigen::operator*((double *)PVar2.m_lhs,(StorageBaseType *)PVar2.m_rhs);
  Eigen::Matrix<double,-1,1,0,-1,1>::operator=
            ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffff8a0,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)in_stack_fffffffffffff898);
  Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  cwiseProduct<Eigen::Matrix<double,_1,1,0,_1,1>>
            ((MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)this_01.m_expression,other);
  Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator-
            ((MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)this_01.m_expression,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)other);
  Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  cwiseProduct<Eigen::Matrix<double,_1,_1,0,_1,_1>>
            ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)this_01.m_expression,
             (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)other);
  Eigen::
  DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::rowwise(in_stack_fffffffffffff8a8);
  Eigen::
  VectorwiseOp<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_1>
  ::sum((VectorwiseOp<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1>
         *)other_00);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Matrix<double,-1,1,0,-1,1>const>const>>
  ::operator-((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
               *)this_01.m_expression,
              (MatrixBase<Eigen::PartialReduxExpr<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::internal::member_sum<double,_double>,_1>_>
               *)other);
  this_02 = Eigen::MatrixBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::noalias
                      ((MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                       in_stack_fffffffffffff898);
  Eigen::NoAlias<Eigen::Matrix<double,-1,1,0,-1,1>,Eigen::MatrixBase>::operator+=
            ((NoAlias<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::MatrixBase> *)other,other_00);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator/=
            (this_00,(Scalar *)this_01.m_expression);
  Eigen::MatrixBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::cwiseInverse
            ((MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)other_00);
  Eigen::Matrix<double,-1,1,0,-1,1>::operator=
            ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffff8a0,in_stack_fffffffffffff898)
  ;
  __x_00 = Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::prod
                     ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)this_02.m_expression);
  dVar1 = sqrt(__x_00);
  *(double *)(in_RDI + 0x240) = dVar1;
  *(undefined1 *)(in_RDI + 0x128) = 1;
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0x30629a);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0x3062a9);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)0x3062b8);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)0x3062c7);
  return;
}

Assistant:

EXPERT_CLASS_TEMPLATE
void LINEAR_EXPERT_base::m_step()
{
    Z meanZ = Sz / Sh;
    X meanX = Sx / Sh;

    if( wNu == 0.0 )
    {
        Nu = meanZ;
        Sigma = Szz;
        Sigma += (wSigma*mixture->getSigma()).asDiagonal();
        Sigma.noalias() -= Sz*Nu.transpose();
        Sigma /= (Sh + wSigma + d + 1.0);
    }
    else
    {
        Nu = (wNu * Nu0 + Sz) / (wNu + Sh);
        Sigma = Szz;
        Sigma += (wSigma*mixture->getSigma()).asDiagonal();
        Sigma.noalias() += (wNu*Nu0)*Nu0.transpose();
        Sigma.noalias() -= ((wNu+Sh)*Nu)*Nu.transpose();
        Sigma /= (Sh + wSigma + d + 2.0);
    }
	invSigma = Sigma.inverse();
    sqrtDetInvSigma = sqrt(invSigma.determinant());

    ZZ zz = Szz;
    zz += (wLambda * Z::Ones(d)).asDiagonal();
    zz.noalias() -= meanZ*Sz.transpose();
    varLambda = zz.inverse();
    XZ xz = Sxz;
    xz.noalias() -= meanX*Sz.transpose();
    Lambda.noalias() = xz * varLambda;
    Mu = meanX;
    Mu.noalias() += Lambda * (Nu - meanZ);

    Psi = wPsi * mixture->getPsi();
    Psi.noalias() += Sxx - meanX.cwiseProduct(Sx) - xz.cwiseProduct(Lambda).rowwise().sum();
    Psi /= (wPsi + Sh + 2.0 );
    invPsi = Psi.cwiseInverse();
    sqrtDetInvPsi = sqrt(invPsi.prod());

    recompute = true;
}